

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

float __thiscall
pbrt::PiecewiseLinear2D<3UL>::Evaluate(PiecewiseLinear2D<3UL> *this,Vector2f pos,Float *param)

{
  int iVar1;
  float fVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  undefined1 auVar7 [16];
  float fVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  int iVar12;
  uint32_t i0;
  uint32_t size;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 in_XMM0_Qb;
  undefined1 auVar17 [16];
  float param_weight [6];
  ulong local_80;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  Float *local_60;
  float local_58 [6];
  anon_class_24_3_14863758 local_40;
  
  local_78 = pos.super_Tuple2<pbrt::Vector2,_float>.x;
  fStack_74 = pos.super_Tuple2<pbrt::Vector2,_float>.y;
  iVar9 = 0;
  uStack_70 = in_XMM0_Qb;
  local_60 = param;
  for (local_80 = 0; local_80 < 3; local_80 = local_80 + 1) {
    if ((ulong)this->m_param_size[local_80] == 1) {
      uVar3 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      *(undefined8 *)(local_58 + local_80 * 2) = uVar3;
    }
    else {
      local_40.this = this;
      local_40.dim = &local_80;
      local_40.param = &local_60;
      sVar11 = FindInterval<pbrt::PiecewiseLinear2D<3ul>::Evaluate(pbrt::Vector2<float>,float_const*)const::_lambda(unsigned_int)_1_>
                         ((ulong)this->m_param_size[local_80],&local_40);
      pfVar6 = (this->m_param_values).ptr[local_80].ptr;
      fVar2 = pfVar6[sVar11 & 0xffffffff];
      auVar17 = ZEXT416((uint)((local_60[local_80] - fVar2) / (pfVar6[(int)sVar11 + 1] - fVar2)));
      auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar17);
      uVar3 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,1);
      fVar2 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar7._0_4_);
      local_58[local_80 * 2 + 1] = fVar2;
      local_58[local_80 * 2] = 1.0 - fVar2;
      iVar9 = (int)sVar11 * this->m_param_strides[local_80] + iVar9;
    }
  }
  auVar7._4_4_ = fStack_74;
  auVar7._0_4_ = local_78;
  auVar7._8_8_ = uStack_70;
  iVar4 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  iVar5 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  local_78 = local_78 * (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x;
  iVar1 = iVar5 + -2;
  auVar7 = vmovshdup_avx(auVar7);
  fVar2 = auVar7._0_4_ * (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y;
  iVar10 = (int)local_78;
  if (iVar4 + -2 < iVar10) {
    iVar10 = iVar4 + -2;
  }
  iVar12 = (int)fVar2;
  fVar8 = local_78 - (float)iVar10;
  if (iVar1 < iVar12) {
    iVar12 = iVar1;
  }
  size = iVar5 * iVar4;
  fVar2 = fVar2 - (float)iVar12;
  i0 = iVar9 * size + iVar10 + iVar12 * iVar4;
  local_78 = 1.0 - fVar2;
  fVar13 = lookup<3UL,_0>(this,(this->m_data).ptr,i0,size,local_58);
  fVar14 = lookup<3UL,_0>(this,(this->m_data).ptr + 1,i0,size,local_58);
  fVar15 = lookup<3UL,_0>(this,(this->m_data).ptr +
                               (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x,i0,size,local_58);
  fVar16 = lookup<3UL,_0>(this,(this->m_data).ptr +
                               (long)(this->m_size).super_Tuple2<pbrt::Vector2,_int>.x + 1,i0,size,
                          local_58);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar14)),ZEXT416((uint)(1.0 - fVar8)),
                           ZEXT416((uint)fVar13));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar16)),ZEXT416((uint)(1.0 - fVar8)),
                            ZEXT416((uint)fVar15));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * fVar2)),auVar7,ZEXT416((uint)local_78));
  return (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
         (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y * auVar7._0_4_;
}

Assistant:

PBRT_CPU_GPU
    float Evaluate(Vector2f pos, const Float *param = nullptr) const {
        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;

        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim][idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Compute linear interpolation weights */
        pos.x *= m_inv_patch_size.x;
        pos.y *= m_inv_patch_size.y;
        Vector2i offset = Min(Vector2i(pos), m_size - Vector2i(2, 2));

        Vector2f w1 = pos - Vector2f(Vector2i(offset)), w0 = Vector2f(1, 1) - w1;

        uint32_t index = offset.x + offset.y * m_size.x;

        uint32_t size = HProd(m_size);
        if (Dimension != 0)
            index += slice_offset * size;

        float v00 = lookup<Dimension>(m_data.data(), index, size, param_weight),
              v10 = lookup<Dimension>(m_data.data() + 1, index, size, param_weight),
              v01 =
                  lookup<Dimension>(m_data.data() + m_size.x, index, size, param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, index, size,
                                      param_weight);

        return FMA(w0.y, FMA(w0.x, v00, w1.x * v10), w1.y * FMA(w0.x, v01, w1.x * v11)) *
               HProd(m_inv_patch_size);
    }